

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

DoubleAPFloat * __thiscall
llvm::detail::DoubleAPFloat::operator=(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  bool bVar1;
  type pAVar2;
  type pAVar3;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  if ((this->Semantics == RHS->Semantics) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&RHS->Floats), bVar1)) {
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,0);
    pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,0);
    APFloat::operator=(pAVar3,pAVar2);
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,1);
    pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,1);
    APFloat::operator=(pAVar3,pAVar2);
  }
  else if (this != RHS) {
    ~DoubleAPFloat(this);
    DoubleAPFloat(this,RHS);
  }
  return this;
}

Assistant:

DoubleAPFloat &DoubleAPFloat::operator=(const DoubleAPFloat &RHS) {
  if (Semantics == RHS.Semantics && RHS.Floats) {
    Floats[0] = RHS.Floats[0];
    Floats[1] = RHS.Floats[1];
  } else if (this != &RHS) {
    this->~DoubleAPFloat();
    new (this) DoubleAPFloat(RHS);
  }
  return *this;
}